

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this,UChar32 start,UChar32 end)

{
  int iVar1;
  UChar32 range [3];
  int local_14;
  int local_10;
  undefined4 local_c;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    if (0x10fffe < start) {
      start = 0x10ffff;
    }
    iVar1 = 0x10ffff;
    if (end < 0x10ffff) {
      iVar1 = end;
    }
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    if (start <= iVar1) {
      if (start < 1) {
        start = 0;
      }
      local_10 = iVar1 + 1;
      local_c = 0x110000;
      local_14 = start;
      exclusiveOr(this,&local_14,2,'\0');
    }
    if (this->pat != (char16_t *)0x0) {
      uprv_free_63(this->pat);
      this->pat = (char16_t *)0x0;
      this->patLen = 0;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(UChar32 start, UChar32 end) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        exclusiveOr(range, 2, 0);
    }
    releasePattern();
    return *this;
}